

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

BasicType __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateBasicType(HeapTypeGeneratorImpl *this)

{
  Random *this_00;
  BasicType BVar1;
  FeatureOptions<wasm::Type::BasicType> *pFVar2;
  FeatureSet local_60 [5];
  FeatureSet local_4c;
  map<wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>_>
  local_48;
  HeapTypeGeneratorImpl *local_10;
  HeapTypeGeneratorImpl *this_local;
  
  this_00 = this->rand;
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_48._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_48._M_t._M_impl._0_8_ = 0;
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_10 = this;
  std::
  map<wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>_>
  ::map(&local_48);
  FeatureSet::FeatureSet(&local_4c,0);
  pFVar2 = Random::FeatureOptions<wasm::Type::BasicType>::
           add<wasm::Type::BasicType,wasm::Type::BasicType,wasm::Type::BasicType>
                     ((FeatureOptions<wasm::Type::BasicType> *)&local_48,local_4c,i32,i64,f32,f64);
  FeatureSet::FeatureSet(local_60,8);
  pFVar2 = Random::FeatureOptions<wasm::Type::BasicType>::add<>(pFVar2,local_60[0],v128);
  BVar1 = Random::pick<wasm::Type::BasicType>(this_00,pFVar2);
  Random::FeatureOptions<wasm::Type::BasicType>::~FeatureOptions
            ((FeatureOptions<wasm::Type::BasicType> *)&local_48);
  return BVar1;
}

Assistant:

Type::BasicType generateBasicType() {
    return rand.pick(
      Random::FeatureOptions<Type::BasicType>{}
        .add(FeatureSet::MVP, Type::i32, Type::i64, Type::f32, Type::f64)
        .add(FeatureSet::SIMD, Type::v128));
  }